

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O3

int Gia_ObjRecognizeMuxLits(Gia_Man_t *p,Gia_Obj_t *pNode,int *iLitT,int *iLitE)

{
  Gia_Obj_t *pGVar1;
  Gia_Obj_t *pGVar2;
  int iVar3;
  Gia_Obj_t *pGVar4;
  Gia_Obj_t *pNodeE;
  Gia_Obj_t *pNodeT;
  Gia_Obj_t *local_28;
  Gia_Obj_t *local_20;
  
  pGVar2 = Gia_ObjRecognizeMux(pNode,&local_20,&local_28);
  if (pGVar2 == (Gia_Obj_t *)0x0) {
    __assert_fail("pCtrl != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaUtil.c"
                  ,0x421,"int Gia_ObjRecognizeMuxLits(Gia_Man_t *, Gia_Obj_t *, int *, int *)");
  }
  pGVar4 = (Gia_Obj_t *)((ulong)local_20 & 0xfffffffffffffffe);
  pGVar1 = p->pObjs;
  if ((pGVar1 <= pGVar4) && (pGVar4 < pGVar1 + p->nObjs)) {
    iVar3 = (int)((ulong)((long)pGVar4 - (long)pGVar1) >> 2);
    if (-1 < iVar3 * -0x55555555) {
      *iLitT = ((uint)local_20 & 1) + iVar3 * 0x55555556;
      pGVar4 = (Gia_Obj_t *)((ulong)local_28 & 0xfffffffffffffffe);
      if ((pGVar4 < pGVar1) || (pGVar1 + p->nObjs <= pGVar4)) goto LAB_0024140e;
      iVar3 = (int)((ulong)((long)pGVar4 - (long)pGVar1) >> 2);
      if (-1 < iVar3 * -0x55555555) {
        *iLitE = ((uint)local_28 & 1) + iVar3 * 0x55555556;
        pGVar4 = (Gia_Obj_t *)((ulong)pGVar2 & 0xfffffffffffffffe);
        if ((pGVar4 < pGVar1) || (pGVar1 + p->nObjs <= pGVar4)) goto LAB_0024140e;
        iVar3 = (int)((ulong)((long)pGVar4 - (long)pGVar1) >> 2);
        if (-1 < iVar3 * -0x55555555) {
          return ((uint)pGVar2 & 1) + iVar3 * 0x55555556;
        }
      }
    }
    __assert_fail("Var >= 0 && !(c >> 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                  ,0x12e,"int Abc_Var2Lit(int, int)");
  }
LAB_0024140e:
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

int Gia_ObjRecognizeMuxLits( Gia_Man_t * p, Gia_Obj_t * pNode, int * iLitT, int * iLitE )
{
    Gia_Obj_t * pNodeT, * pNodeE;
    Gia_Obj_t * pCtrl = Gia_ObjRecognizeMux( pNode, &pNodeT, &pNodeE );
    assert( pCtrl != NULL );
    *iLitT = Gia_Obj2Lit( p, pNodeT );
    *iLitE = Gia_Obj2Lit( p, pNodeE );
    return Gia_Obj2Lit( p, pCtrl );
}